

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<Lesson,_std::allocator<Lesson>_> *
find_free_spot_for_lesson
          (vector<Lesson,_std::allocator<Lesson>_> *__return_storage_ptr__,Group *group,
          string *lesson_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>_>
          *possible_places,bool doubled)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  iterator __first;
  iterator __last;
  reference pLVar5;
  reference piVar6;
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [32];
  Lesson local_4a0;
  int local_3f4;
  iterator iStack_3f0;
  int id_1;
  iterator __end7;
  iterator __begin7;
  vector<int,_std::allocator<int>_> *__range7;
  undefined1 auStack_3d0 [7];
  bool flag_1;
  Lesson lesson_2;
  iterator __end5_1;
  iterator __begin5_1;
  vector<Lesson,_std::allocator<Lesson>_> *__range5_1;
  Lesson lesson_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<Lesson,_std::allocator<Lesson>_> *__range4_1;
  iterator iStack_248;
  int id;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  undefined1 auStack_228 [7];
  bool flag;
  Lesson lesson_3;
  iterator __end4;
  iterator __begin4;
  vector<Lesson,_std::allocator<Lesson>_> *__range4;
  undefined1 local_158 [8];
  vector<Lesson,_std::allocator<Lesson>_> all_lessons_with_this_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>
  *it;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>_>
  *__range1_1;
  undefined1 local_110 [8];
  Lesson lesson;
  iterator __end1;
  iterator __begin1;
  vector<Lesson,_std::allocator<Lesson>_> *__range1;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> busy_ids;
  bool doubled_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>_>
  *possible_places_local;
  string *lesson_name_local;
  Group *group_local;
  vector<Lesson,_std::allocator<Lesson>_> *new_lessons;
  
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = doubled;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
  bVar1 = false;
  std::vector<Lesson,_std::allocator<Lesson>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<Lesson,_std::allocator<Lesson>_>::begin(&group->lesson_map);
  lesson._160_8_ = std::vector<Lesson,_std::allocator<Lesson>_>::end(&group->lesson_map);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>
                                     *)&lesson.field_0xa0), bVar2) {
    pLVar5 = __gnu_cxx::__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
             operator*(&__end1);
    Lesson::Lesson((Lesson *)local_110,pLVar5);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &lesson.exist,"");
    if (bVar2) {
      __range1_1._0_4_ = local_110._0_4_;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_48,(value_type_conflict1 *)&__range1_1);
    }
    Lesson::~Lesson((Lesson *)local_110);
    __gnu_cxx::__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>_>
             ::begin(possible_places);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>_>
          ::end(possible_places);
  while (bVar2 = std::operator!=(&__end1_1,(_Self *)&it), bVar2) {
    all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>
                  ::operator*(&__end1_1);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            all_lessons_with_this_name.
                            super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,lesson_name);
    if (_Var3) {
      std::vector<Lesson,_std::allocator<Lesson>_>::vector
                ((vector<Lesson,_std::allocator<Lesson>_> *)local_158,
                 (vector<Lesson,_std::allocator<Lesson>_> *)
                 &(all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x20);
      __first = std::begin<std::vector<Lesson,std::allocator<Lesson>>>
                          ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
      __last = std::end<std::vector<Lesson,std::allocator<Lesson>>>
                         ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
      std::
      shuffle<__gnu_cxx::__normal_iterator<Lesson*,std::vector<Lesson,std::allocator<Lesson>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>)
                 __first._M_current,
                 (__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>)
                 __last._M_current,&rng);
      if ((busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._7_1_ & 1) == 0) {
        __end4 = std::vector<Lesson,_std::allocator<Lesson>_>::begin
                           ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
        lesson_3._160_8_ =
             std::vector<Lesson,_std::allocator<Lesson>_>::end
                       ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>
                                           *)&lesson_3.field_0xa0), bVar2) {
          pLVar5 = __gnu_cxx::
                   __normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
                   operator*(&__end4);
          Lesson::Lesson((Lesson *)auStack_228,pLVar5);
          bVar2 = true;
          __end5 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)local_48);
          iStack_248 = std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)local_48);
          while (bVar4 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffdb8), bVar4) {
            piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end5);
            if (_auStack_228 == (long)*piVar6) {
              bVar2 = false;
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end5);
          }
          if (bVar2) {
            std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                      (__return_storage_ptr__,(value_type *)auStack_228);
            bVar1 = true;
          }
          Lesson::~Lesson((Lesson *)auStack_228);
          if (bVar2) goto LAB_00134280;
          __gnu_cxx::__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
          operator++(&__end4);
        }
      }
      else {
        __end4_1 = std::vector<Lesson,_std::allocator<Lesson>_>::begin
                             ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
        lesson_1._160_8_ =
             std::vector<Lesson,_std::allocator<Lesson>_>::end
                       ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>
                                   *)&lesson_1.field_0xa0), bVar2) {
          pLVar5 = __gnu_cxx::
                   __normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
                   operator*(&__end4_1);
          Lesson::Lesson((Lesson *)&__range5_1,pLVar5);
          __end5_1 = std::vector<Lesson,_std::allocator<Lesson>_>::begin
                               ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
          lesson_2._160_8_ =
               std::vector<Lesson,_std::allocator<Lesson>_>::end
                         ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5_1,
                                    (__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>
                                     *)&lesson_2.field_0xa0), bVar2) {
            pLVar5 = __gnu_cxx::
                     __normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
                     operator*(&__end5_1);
            Lesson::Lesson((Lesson *)auStack_3d0,pLVar5);
            bVar2 = true;
            if ((_auStack_3d0 - (long)__range5_1 == 1) &&
               (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&lesson_1.field_0x48,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&lesson_2.field_0x48), _Var3)) {
              __end7 = std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)local_48);
              iStack_3f0 = std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)local_48);
              while (bVar4 = __gnu_cxx::operator!=(&__end7,&stack0xfffffffffffffc10), bVar4) {
                piVar6 = __gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&__end7);
                local_3f4 = *piVar6;
                if ((__range5_1 == (vector<Lesson,_std::allocator<Lesson>_> *)(long)local_3f4) ||
                   (_auStack_3d0 == (long)local_3f4)) {
                  bVar2 = false;
                }
                __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&__end7);
              }
              if (!bVar2) goto LAB_001341fc;
              std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                        (__return_storage_ptr__,(value_type *)&__range5_1);
              std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                        (__return_storage_ptr__,(value_type *)auStack_3d0);
              bVar1 = true;
              bVar2 = true;
            }
            else {
LAB_001341fc:
              bVar2 = false;
            }
            Lesson::~Lesson((Lesson *)auStack_3d0);
            if (bVar2) goto LAB_0013423b;
            __gnu_cxx::__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
            operator++(&__end5_1);
          }
          bVar2 = false;
LAB_0013423b:
          Lesson::~Lesson((Lesson *)&__range5_1);
          if (bVar2) goto LAB_00134280;
          __gnu_cxx::__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
          operator++(&__end4_1);
        }
      }
      bVar2 = false;
LAB_00134280:
      std::vector<Lesson,_std::allocator<Lesson>_>::~vector
                ((vector<Lesson,_std::allocator<Lesson>_> *)local_158);
      if (bVar2) goto LAB_00134540;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>
    ::operator++(&__end1_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"",&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"",&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"",&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"",&local_539);
  Lesson::Lesson(&local_4a0,0,false,false,false,(string *)local_4c0,(string *)local_4e8,
                 (string *)local_510,(string *)local_538);
  std::vector<Lesson,_std::allocator<Lesson>_>::push_back(__return_storage_ptr__,&local_4a0);
  Lesson::~Lesson(&local_4a0);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  bVar1 = true;
LAB_00134540:
  if (!bVar1) {
    std::vector<Lesson,_std::allocator<Lesson>_>::~vector(__return_storage_ptr__);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Lesson> find_free_spot_for_lesson(Group group, std::string lesson_name, std::map<std::string, std::vector<Lesson>> possible_places, bool doubled) {
    //BUSY IDS
    std::vector<int> busy_ids;
    std::vector<Lesson> new_lessons;
    for (auto lesson:group.lesson_map) {
        if (lesson.subject != "")
            busy_ids.push_back(lesson.lesson_id);
    }

    for(const auto & it: possible_places) {
        if(it.first == lesson_name) {
            std::vector<Lesson> all_lessons_with_this_name = it.second;
            std::shuffle(std::begin(all_lessons_with_this_name), std::end(all_lessons_with_this_name), rng); //shuffle lessons
            if(doubled == false) {
                for (auto lesson:all_lessons_with_this_name) {
                    bool flag = true;
                    for (auto id: busy_ids) {
                       if (lesson.lesson_id == id)
                           flag = false;
                   }
                   if (flag == true) {
                       new_lessons.push_back(lesson);
                        //std::cout<<lesson_name << std::endl;
                        //lesson.print();
                        //std::cout<<lesson.lesson_id<<std::endl;
                        return new_lessons;
                   }

                }
            }
            else {
                for(auto lesson_1: all_lessons_with_this_name) {
                    for(auto lesson_2: all_lessons_with_this_name) {
                        bool flag = true;
                        if (((lesson_2.lesson_id - lesson_1.lesson_id) == 1) && (lesson_1.professor == lesson_2.professor)) {

                            for(auto id: busy_ids) {
                                if ((lesson_1.lesson_id == id) || (lesson_2.lesson_id == id))
                                    flag = false;
                            }
                            if (flag == true) {
                                new_lessons.push_back(lesson_1);
                                new_lessons.push_back(lesson_2);
                                return new_lessons;
                            }
                        }


                    }
                }
            }
        }
    }
    new_lessons.push_back(Lesson());
    return new_lessons;
}